

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaBinrIO.cpp
# Opt level: O2

bool __thiscall NaBinaryStreamFile::GoNextRecord(NaBinaryStreamFile *this)

{
  int iVar1;
  size_t sVar2;
  undefined4 *puVar3;
  size_t __n;
  
  __n = (size_t)this->nVar;
  sVar2 = fread(this->vCurLine,this->nDataSize,__n,(FILE *)this->fp);
  if (sVar2 == __n) {
    this->iCurLine = this->iCurLine + 1;
  }
  else {
    iVar1 = feof((FILE *)this->fp);
    if (iVar1 == 0) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 7;
      __cxa_throw(puVar3,&NaException::typeinfo,0);
    }
  }
  return sVar2 == __n;
}

Assistant:

bool
NaBinaryStreamFile::GoNextRecord ()
{
  if(nVar != fread(vCurLine, nDataSize, nVar, fp))
    {
      if(feof(fp))
	return false;
      throw(na_read_error);
    }
  ++iCurLine;

  return true;
}